

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

void skip(vorb *z,int n)

{
  uint8 *puVar1;
  int64_t iVar2;
  
  if (z->stream != (uint8 *)0x0) {
    puVar1 = z->stream + n;
    z->stream = puVar1;
    if (z->stream_end <= puVar1) {
      z->eof = 1;
    }
    return;
  }
  iVar2 = (*z->f->seek)(z->f->data,0,1);
  (*z->f->seek)(z->f->data,n + iVar2,0);
  return;
}

Assistant:

static void skip(vorb *z, int n)
{
   if (USE_MEMORY(z)) {
      z->stream += n;
      if (z->stream >= z->stream_end) z->eof = 1;
      return;
   }
   #ifndef STB_VORBIS_NO_STDIO
   {
      long x = ftell(z->f);
      fseek(z->f, x+n, SEEK_SET);
   }
   #endif
}